

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

optional<unsigned_int> *
tinyusdz::value::TryGetUnderlyingTypeId
          (optional<unsigned_int> *__return_storage_ptr__,string *tyname)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  const_iterator cVar4;
  uint uVar5;
  bool bVar6;
  string s;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  utyidmap;
  optional<unsigned_int> local_2a0;
  ulong local_298;
  long local_290 [2];
  optional<unsigned_int> local_280;
  ulong local_278;
  long local_270 [2];
  long *local_260;
  ulong local_258;
  long local_250 [2];
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  local_240;
  
  memcpy(&local_240,&PTR_anon_var_dwarf_3083d6_004762c0,0x210);
  pcVar2 = (tyname->_M_dataplus)._M_p;
  local_2a0 = (optional<unsigned_int>)local_290;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,pcVar2,pcVar2 + tyname->_M_string_length);
  local_280 = (optional<unsigned_int>)local_270;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"[]","");
  if (tyname->_M_string_length < local_278) {
    bVar6 = false;
  }
  else {
    lVar3 = ::std::__cxx11::string::find
                      ((char *)tyname,(ulong)local_280,tyname->_M_string_length - local_278);
    bVar6 = lVar3 != -1;
  }
  if (local_280 != (optional<unsigned_int>)local_270) {
    operator_delete((void *)local_280,local_270[0] + 1);
  }
  uVar5 = 0;
  if (!bVar6) goto LAB_002c57c0;
  local_260 = local_250;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"[]","");
  if (local_298 < local_258) {
LAB_002c5763:
    local_280 = (optional<unsigned_int>)local_270;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,local_2a0,local_298 + (long)local_2a0);
  }
  else {
    lVar3 = ::std::__cxx11::string::find
                      (&local_2a0.has_value_,(ulong)local_260,local_298 - local_258);
    if (lVar3 == -1) goto LAB_002c5763;
    ::std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_2a0);
  }
  ::std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_280);
  if (local_280 != (optional<unsigned_int>)local_270) {
    operator_delete((void *)local_280,local_270[0] + 1);
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  uVar5 = 0x100000;
LAB_002c57c0:
  local_280 = local_2a0;
  cVar4 = mapbox::eternal::impl::
          map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
          ::find(&local_240,(key_type *)&local_280);
  if (cVar4.pos ==
      (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
      &stack0xffffffffffffffd0) {
    if (local_2a0 != (optional<unsigned_int>)local_290) {
      operator_delete((void *)local_2a0,local_290[0] + 1);
    }
    TryGetTypeId(&local_2a0,tyname);
    __return_storage_ptr__->has_value_ = local_2a0.has_value_;
    if (local_2a0.has_value_ == true) {
      __return_storage_ptr__->contained = local_2a0.contained;
    }
  }
  else {
    uVar1 = ((cVar4.pos)->super_element<mapbox::eternal::string,_unsigned_int>).pair.second;
    __return_storage_ptr__->has_value_ = true;
    __return_storage_ptr__->contained = (storage_t<unsigned_int>)(uVar5 | uVar1);
    if (local_2a0 != (optional<unsigned_int>)local_290) {
      operator_delete((void *)local_2a0,local_290[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<uint32_t> TryGetUnderlyingTypeId(const std::string &tyname) {
  MAPBOX_ETERNAL_CONSTEXPR const auto utyidmap =
      mapbox::eternal::hash_map<mapbox::eternal::string, uint32_t>({
        {kPoint3h, TYPE_ID_HALF3},
        {kPoint3f, TYPE_ID_FLOAT3},
        {kPoint3d, TYPE_ID_DOUBLE3},
        {kNormal3h, TYPE_ID_HALF3},
        {kNormal3f, TYPE_ID_FLOAT3},
        {kNormal3d, TYPE_ID_DOUBLE3},
        {kVector3h, TYPE_ID_HALF3},
        {kVector3f, TYPE_ID_FLOAT3},
        {kVector3d, TYPE_ID_DOUBLE3},
        {kColor3h, TYPE_ID_HALF3},
        {kColor3f, TYPE_ID_FLOAT3},
        {kColor3d, TYPE_ID_DOUBLE3},
        {kColor4h, TYPE_ID_HALF4},
        {kColor4f, TYPE_ID_FLOAT4},
        {kColor4d, TYPE_ID_DOUBLE4},
        {kTexCoord2h, TYPE_ID_HALF2},
        {kTexCoord2f, TYPE_ID_FLOAT2},
        {kTexCoord2d, TYPE_ID_DOUBLE3},
        {kTexCoord3h, TYPE_ID_HALF3},
        {kTexCoord3f, TYPE_ID_FLOAT3},
        {kTexCoord3d, TYPE_ID_DOUBLE4},
        {kFrame4d, TYPE_ID_MATRIX4D},
  });

  {
    std::string s = tyname;
    uint32_t array_bit = 0;
    if (endsWith(tyname, "[]")) {
      s = removeSuffix(s, "[]");
      array_bit |= TYPE_ID_1D_ARRAY_BIT;
    }

    auto ret = utyidmap.find(s.c_str());
    if (ret != utyidmap.end()) {
      return ret->second | array_bit;
    }
  }

  // Fallback
  return TryGetTypeId(tyname);
}